

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QString * QSysInfo::productVersion(void)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QUnixOSVersion unixOsVersion;
  QUnixOSVersion *in_stack_ffffffffffffff68;
  QUnixOSVersion *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QUnixOSVersion::QUnixOSVersion(in_stack_ffffffffffffff70);
  findUnixOsVersion(in_stack_ffffffffffffff68);
  bVar2 = QString::isEmpty((QString *)0x25aeb4);
  if (bVar2) {
    unknownText();
  }
  else {
    QString::QString(&in_stack_ffffffffffffff70->productType,&in_stack_ffffffffffffff68->productType
                    );
  }
  QUnixOSVersion::~QUnixOSVersion(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::productVersion()
{
#if defined(Q_OS_ANDROID) || defined(Q_OS_DARWIN)
    const auto version = QOperatingSystemVersion::current();
    return QString::asprintf("%d.%d", version.majorVersion(), version.minorVersion());
#elif defined(Q_OS_WIN)
    const char *version = osVer_helper();
    if (version) {
        const QLatin1Char spaceChar(' ');
        return QString::fromLatin1(version).remove(spaceChar).toLower() + winSp_helper().remove(spaceChar).toLower();
    }
    // fall through

#elif defined(Q_OS_VXWORKS)
    utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.releaseversion);
    // fall through

#elif defined(USE_ETC_OS_RELEASE) // Q_OS_UNIX
    QUnixOSVersion unixOsVersion;
    findUnixOsVersion(unixOsVersion);
    if (!unixOsVersion.productVersion.isEmpty())
        return unixOsVersion.productVersion;
#endif

    // fallback
    return unknownText();
}